

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O2

int buffer_pread(int fd,char *s,uint len)

{
  uint64 *puVar1;
  int iVar2;
  ulong uVar3;
  ssize_t sVar4;
  int *piVar5;
  uint uVar6;
  ulong uVar7;
  size_t __nbytes;
  long lVar8;
  
  __nbytes = (size_t)len;
  lVar8 = 0x10;
  for (uVar7 = 0; uVar3 = (ulong)dirn, uVar7 < uVar3; uVar7 = uVar7 + 1) {
    buffer_flush((buffer *)((long)&dir->fddir + lVar8));
    lVar8 = lVar8 + 0xf0;
  }
  if (rotateasap != 0) {
    lVar8 = 0;
    for (uVar7 = 0; uVar7 < uVar3; uVar7 = uVar7 + 1) {
      rotate((logdir *)((long)&dir->fddir + lVar8));
      uVar3 = (ulong)dirn;
      lVar8 = lVar8 + 0xf0;
    }
    rotateasap = 0;
  }
  if (exitasap != 0) {
    if (linecomplete != 0) {
      return 0;
    }
    __nbytes = 1;
  }
  if (reopenasap != 0) {
    logdirs_reopen();
    reopenasap = 0;
  }
  taia_now(&now);
  taia_uint(&trotate,0xab8);
  taia_add(&trotate,&now,&trotate);
  lVar8 = 0x68;
  uVar6 = dirn;
  for (uVar7 = 0; uVar7 < uVar6; uVar7 = uVar7 + 1) {
    if (*(long *)((long)dir + lVar8 + -8) != 0) {
      iVar2 = taia_less((taia *)((long)&dir->fddir + lVar8),&now);
      if (iVar2 != 0) {
        rotate((logdir *)((long)dir + lVar8 + -0x68));
      }
      iVar2 = taia_less((taia *)((long)&dir->fddir + lVar8),&trotate);
      uVar6 = dirn;
      if (iVar2 != 0) {
        puVar1 = (uint64 *)((long)&dir->fddir + lVar8);
        trotate.sec.x = *puVar1;
        trotate.nano = puVar1[1];
        trotate.atto = *(unsigned_long *)((long)&(dir->b).x + lVar8);
      }
    }
    lVar8 = lVar8 + 0xf0;
  }
  sig_unblock(sig_term);
  sig_unblock(sig_child);
  sig_unblock(sig_alarm);
  sig_unblock(sig_hangup);
  iopause(&in,1,&trotate,&now);
  sig_block(sig_term);
  sig_block(sig_child);
  sig_block(sig_alarm);
  sig_block(sig_hangup);
  sVar4 = read(fd,s,__nbytes);
  iVar2 = (int)sVar4;
  if (iVar2 == -1) {
    piVar5 = __errno_location();
    if (*piVar5 == error_again) {
      *piVar5 = error_intr;
      iVar2 = -1;
    }
    else {
      iVar2 = -1;
      if (*piVar5 != error_intr) {
        warn("unable to read standard input");
      }
    }
  }
  else if (0 < iVar2) {
    linecomplete = (uint)(s[iVar2 - 1] == '\n');
  }
  return iVar2;
}

Assistant:

int buffer_pread(int fd, char *s, unsigned int len) {
  int i;

  for (i =0; i < dirn; ++i) buffer_flush(&dir[i].b);
  if (rotateasap) {
    for (i =0; i < dirn; ++i) rotate(dir +i);
    rotateasap =0;
  }
  if (exitasap) {
    if (linecomplete) return(0);
    len =1;
  }
  if (reopenasap) {
    logdirs_reopen();
    reopenasap =0;
  }
  taia_now(&now);
  taia_uint(&trotate, 2744);
  taia_add(&trotate, &now, &trotate);
  for (i =0; i < dirn; ++i)
    if ((dir +i)->tmax) {
      if (taia_less(&dir[i].trotate, &now)) rotate(dir +i);
      if (taia_less(&dir[i].trotate, &trotate)) trotate =dir[i].trotate;
    }
  sig_unblock(sig_term);
  sig_unblock(sig_child);
  sig_unblock(sig_alarm);
  sig_unblock(sig_hangup);
  iopause(&in, 1, &trotate, &now);
  sig_block(sig_term);
  sig_block(sig_child);
  sig_block(sig_alarm);
  sig_block(sig_hangup);
  i =read(fd, s, len);
  if (i == -1) {
    if (errno == error_again) errno =error_intr;
    if (errno != error_intr) warn("unable to read standard input");
  }
  if (i > 0) linecomplete =(s[i -1] == '\n');
  return(i);
}